

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_NodalProjector.cpp
# Opt level: O0

void __thiscall
Hydro::NodalProjector::NodalProjector
          (NodalProjector *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_vel
          ,Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *a_sigma,
          Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *a_geom,LPInfo *a_lpinfo,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_S_cc,
          Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *a_S_nd)

{
  undefined1 *in_RDI;
  BoxArray *this_00;
  LPInfo *in_stack_00000338;
  NodalProjector *in_stack_00000340;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *in_stack_ffffffffffffff48;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *in_stack_ffffffffffffff50;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 1;
  *(undefined4 *)(in_RDI + 4) = 0;
  amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::Vector
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  amrex::
  Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>::
  Vector((Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
          *)0x9f1e67);
  amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
             in_stack_ffffffffffffff50,
             (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
             in_stack_ffffffffffffff48);
  amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::Vector
            ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)0x9f1e97);
  amrex::Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::Vector
            ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)0x9f1eaa);
  amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
             in_stack_ffffffffffffff50,
             (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
             in_stack_ffffffffffffff48);
  amrex::Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::Vector
            ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
             in_stack_ffffffffffffff50,
             (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
             in_stack_ffffffffffffff48);
  *(undefined8 *)(in_RDI + 0xb0) = 0;
  amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::Vector
            ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)0x9f1f08);
  amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::Vector
            ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)0x9f1f1e);
  amrex::Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::Vector
            ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
             in_stack_ffffffffffffff50,
             (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
             in_stack_ffffffffffffff48);
  this_00 = (BoxArray *)(in_RDI + 0x100);
  std::unique_ptr<amrex::MLNodeLaplacian,std::default_delete<amrex::MLNodeLaplacian>>::
  unique_ptr<std::default_delete<amrex::MLNodeLaplacian>,void>
            ((unique_ptr<amrex::MLNodeLaplacian,_std::default_delete<amrex::MLNodeLaplacian>_> *)
             this_00);
  std::unique_ptr<amrex::MLMG,std::default_delete<amrex::MLMG>>::
  unique_ptr<std::default_delete<amrex::MLMG>,void>
            ((unique_ptr<amrex::MLMG,_std::default_delete<amrex::MLMG>_> *)this_00);
  amrex::IntVect::IntVect((IntVect *)(in_RDI + 0x128));
  amrex::BoxArray::BoxArray(this_00);
  *(undefined8 *)(in_RDI + 0x1a0) = 0;
  *(undefined8 *)(in_RDI + 0x1a8) = 0;
  define(in_stack_00000340,in_stack_00000338);
  return;
}

Assistant:

NodalProjector::NodalProjector ( const amrex::Vector<amrex::MultiFab*>&       a_vel,
                                 const amrex::Vector<const amrex::MultiFab*>& a_sigma,
                                 const amrex::Vector<amrex::Geometry>&        a_geom,
                                 const LPInfo&                                a_lpinfo,
                                 const amrex::Vector<amrex::MultiFab*>&       a_S_cc,
                                 const amrex::Vector<const amrex::MultiFab*>& a_S_nd )
    : m_geom(a_geom),
      m_vel(a_vel),
      m_S_cc(a_S_cc),
      m_sigma(a_sigma),
      m_S_nd(a_S_nd)
{
    define(a_lpinfo);
}